

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_writer.cpp
# Opt level: O2

void __thiscall VM_Writer::write_call(VM_Writer *this,string *name,int n_args)

{
  ostream *poVar1;
  string sStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  poVar1 = (ostream *)this->out_file;
  std::operator+(&local_38,"call ",name);
  std::operator+(&local_78,&local_38," ");
  std::__cxx11::to_string(&sStack_98,n_args);
  std::operator+(&local_58,&local_78,&sStack_98);
  poVar1 = std::operator<<(poVar1,(string *)&local_58);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&sStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void VM_Writer::write_call(const std::string &name, int n_args) {
    out_file << "call " + name +  " " + std::to_string(n_args)  << std::endl;
}